

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O3

void __thiscall
ary::AnchoredLocalization::draw(AnchoredLocalization *this,Mat *image,SharedCameraModel *model)

{
  undefined8 uVar1;
  element_type *peVar2;
  undefined1 auVar3 [16];
  double dVar4;
  SharedCameraModel *pSVar5;
  pointer pPVar6;
  long lVar7;
  undefined1 *puVar8;
  _OutputArray *p_Var9;
  int i;
  Size SVar10;
  long lVar11;
  ulong uVar12;
  Mat *pMVar13;
  double s;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> model2ImagePts;
  CameraPosition camera;
  Matx<double,_4,_1> c;
  Mat modelPts;
  Matx44f offset;
  _InputArray local_338;
  uchar *local_320;
  Size local_318;
  AnchoredLocalization *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  SharedCameraModel *local_2e0;
  long local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  float *local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  MatConstIterator local_2a0;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  uchar *local_258;
  uchar *puStack_250;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  uchar *local_1e8;
  uchar *local_1e0;
  _OutputArray local_190;
  _InputArray local_178;
  _InputArray local_160;
  _InputArray local_148;
  _InputArray local_130;
  undefined1 local_118 [16];
  uchar *local_108;
  uchar *puStack_100;
  uchar *local_f8;
  uchar *puStack_f0;
  MatAllocator *local_e8;
  UMatData *pUStack_e0;
  MatSize local_d8;
  size_t *psStack_d0;
  size_t local_c8;
  size_t sStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78 [9];
  
  pPVar6 = (this->localizations).
           super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->localizations).
      super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar6) {
    uVar12 = 0;
    local_310 = this;
    local_2e0 = model;
    do {
      peVar2 = pPVar6[uVar12].super_shared_ptr<ary::Localization>.
               super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar2->_vptr_Localization[3])(peVar2,image);
      local_2a8 = 0;
      local_2b8 = (float *)0x0;
      uStack_2b0 = 0;
      lVar7 = (long)(local_310->anchors).
                    super__Vector_base<cv::Ptr<ary::SceneAnchor>,_std::allocator<cv::Ptr<ary::SceneAnchor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                    super_shared_ptr<ary::SceneAnchor>.
                    super___shared_ptr<ary::SceneAnchor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78[6] = *(undefined8 *)(lVar7 + 0x58);
      local_78[7] = *(undefined8 *)(lVar7 + 0x60);
      local_78[4] = *(undefined8 *)(lVar7 + 0x48);
      local_78[5] = *(undefined8 *)(lVar7 + 0x50);
      local_78[2] = *(undefined8 *)(lVar7 + 0x38);
      local_78[3] = *(undefined8 *)(lVar7 + 0x40);
      local_78[0] = *(undefined8 *)(lVar7 + 0x28);
      local_78[1] = *(undefined8 *)(lVar7 + 0x30);
      local_1e8 = (uchar *)0x0;
      local_1f8._0_4_ = 0;
      local_1f8._4_4_ = 0;
      uStack_1f0._0_4_ = 0;
      uStack_1f0._4_4_ = 0;
      local_1e0 = (uchar *)0x3ff0000000000000;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      sStack_c0 = 0;
      local_d8.p = (int *)0x0;
      psStack_d0 = (size_t *)0x0;
      local_e8 = (MatAllocator *)0x0;
      pUStack_e0 = (UMatData *)0x0;
      local_f8 = (uchar *)0x0;
      puStack_f0 = (uchar *)0x0;
      local_108 = (uchar *)0x0;
      puStack_100 = (uchar *)0x0;
      local_118._0_4_ = 0;
      local_118._4_4_ = 0;
      local_118._8_4_ = 0;
      local_118._12_4_ = 0;
      lVar7 = 0;
      do {
        uVar1 = *(undefined8 *)((long)local_78 + lVar7 * 4);
        dVar4 = (double)(float)((ulong)uVar1 >> 0x20);
        auVar3._8_4_ = SUB84(dVar4,0);
        auVar3._0_8_ = (double)(float)uVar1;
        auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])(local_118 + lVar7 * 8) = auVar3;
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0x10);
      puVar8 = local_118;
      lVar7 = 0;
      do {
        dVar4 = 0.0;
        lVar11 = 0;
        do {
          dVar4 = dVar4 + *(double *)(puVar8 + lVar11 * 8) * *(double *)(local_1f8 + lVar11 * 8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        *(double *)(local_268 + (lVar7 * 2 + -2) * 4 + 8) = dVar4;
        lVar7 = lVar7 + 1;
        puVar8 = puVar8 + 0x20;
      } while (lVar7 != 4);
      local_118._0_8_ = local_268._0_8_;
      local_118._8_8_ = local_268._8_8_;
      local_108 = local_258;
      puStack_100 = puStack_250;
      local_268._0_8_ = 0;
      local_268._8_4_ = 0;
      local_268._12_4_ = 0;
      lVar7 = 0;
      do {
        *(ulong *)(local_268 + (lVar7 + -2) * 4 + 8) =
             CONCAT44((float)*(double *)(local_118 + lVar7 * 8 + 8),
                      (float)*(double *)(local_118 + lVar7 * 8));
        lVar7 = lVar7 + 2;
      } while (lVar7 != 4);
      local_2f8 = local_268._0_8_;
      uStack_2f0 = 0;
      local_308._0_4_ = (float)local_268._8_4_;
      local_308._4_4_ = (float)local_268._12_4_;
      uStack_300 = 0;
      local_2d8 = uVar12 * 0x10;
      cv::Mat::Mat((Mat *)local_1f8,3,3,5);
      cv::MatConstIterator::MatConstIterator(&local_2a0,(Mat *)local_1f8);
      *(float *)local_2a0.ptr = 0.01;
      if (local_2a0.m == (Mat *)0x0) {
        pMVar13 = (Mat *)0x0;
        SVar10 = (Size)local_2a0.ptr;
      }
      else {
        SVar10 = (Size)((long)local_2a0.ptr + local_2a0.elemSize);
        pMVar13 = local_2a0.m;
        if (local_2a0.sliceEnd <= (long)local_2a0.ptr + local_2a0.elemSize) {
          cv::MatConstIterator::seek((long)&local_2a0,true);
          SVar10 = (Size)local_2a0.ptr;
          pMVar13 = local_2a0.m;
        }
      }
      local_278 = local_2f8._4_4_ / local_308._4_4_;
      fStack_274 = local_2f8._4_4_;
      fStack_270 = local_2f8._4_4_;
      fStack_26c = local_2f8._4_4_;
      local_308 = CONCAT44(local_308._4_4_,(float)local_308 / local_308._4_4_);
      local_320 = local_2a0.sliceStart;
      *(float *)SVar10 = 0.01;
      local_338._0_8_ = pMVar13;
      local_338.sz = SVar10;
      if (pMVar13 == (Mat *)0x0) {
LAB_0011aba2:
        *(float *)local_338.sz = 0.0;
LAB_0011aba8:
        *(float *)local_338.sz = 0.0;
LAB_0011abae:
        *(float *)local_338.sz = local_278;
LAB_0011abba:
        *(float *)local_338.sz = (float)local_308;
LAB_0011abc3:
        pMVar13 = (Mat *)0x0;
        SVar10 = local_338.sz;
      }
      else {
        SVar10 = (Size)(local_2a0.elemSize + (long)SVar10);
        local_208 = local_308._4_4_;
        fStack_204 = local_308._4_4_;
        fStack_200 = local_308._4_4_;
        fStack_1fc = local_308._4_4_;
        local_338.obj = (void *)local_2a0.elemSize;
        local_318 = (Size)local_2a0.sliceEnd;
        if ((ulong)SVar10 < local_2a0.sliceEnd) {
          *(float *)SVar10 = 0.01;
        }
        else {
          cv::MatConstIterator::seek((long)&local_338,true);
          *(float *)local_338.sz = 0.01;
          SVar10 = local_338.sz;
          if ((Mat *)local_338._0_8_ == (Mat *)0x0) goto LAB_0011aba2;
        }
        local_338.sz = (Size)((long)local_338.obj + (long)SVar10);
        if ((ulong)local_338.sz < (ulong)local_318) {
          *(float *)local_338.sz = 0.0;
        }
        else {
          local_338.sz = SVar10;
          cv::MatConstIterator::seek((long)&local_338,true);
          *(float *)local_338.sz = 0.0;
          if ((Mat *)local_338._0_8_ == (Mat *)0x0) goto LAB_0011aba8;
        }
        local_2f8 = CONCAT44(local_2f8._4_4_,(float)local_2f8 / local_208);
        SVar10 = (Size)((long)local_338.obj + (long)local_338.sz);
        if ((ulong)local_318 <= (ulong)SVar10) {
          cv::MatConstIterator::seek((long)&local_338,true);
          *(float *)local_338.sz = 0.0;
          SVar10 = local_338.sz;
          if ((Mat *)local_338._0_8_ != (Mat *)0x0) goto LAB_0011afd9;
          *(float *)local_338.sz = (float)local_2f8;
LAB_0011b159:
          *(float *)local_338.sz = (float)local_308;
          goto LAB_0011abc3;
        }
        *(float *)SVar10 = 0.0;
LAB_0011afd9:
        local_338.sz = (Size)((long)local_338.obj + (long)SVar10);
        if ((ulong)local_338.sz < (ulong)local_318) {
          *(float *)local_338.sz = 0.0;
        }
        else {
          local_338.sz = SVar10;
          cv::MatConstIterator::seek((long)&local_338,true);
          *(float *)local_338.sz = 0.0;
          if ((Mat *)local_338._0_8_ == (Mat *)0x0) goto LAB_0011abae;
        }
        SVar10 = (Size)((long)local_338.obj + (long)local_338.sz);
        if ((ulong)SVar10 < (ulong)local_318) {
          *(float *)SVar10 = (float)local_2f8;
        }
        else {
          cv::MatConstIterator::seek((long)&local_338,true);
          *(float *)local_338.sz = (float)local_2f8;
          SVar10 = local_338.sz;
          if ((Mat *)local_338._0_8_ == (Mat *)0x0) goto LAB_0011b159;
        }
        local_338.sz = (Size)((long)local_338.obj + (long)SVar10);
        if ((ulong)local_338.sz < (ulong)local_318) {
          *(float *)local_338.sz = local_278;
        }
        else {
          local_338.sz = SVar10;
          cv::MatConstIterator::seek((long)&local_338,true);
          *(float *)local_338.sz = local_278;
          if ((Mat *)local_338._0_8_ == (Mat *)0x0) goto LAB_0011abba;
        }
        SVar10 = (Size)((long)local_338.obj + (long)local_338.sz);
        if ((ulong)SVar10 < (ulong)local_318) {
          *(float *)SVar10 = (float)local_308;
          local_338.sz = SVar10;
        }
        else {
          cv::MatConstIterator::seek((long)&local_338,true);
          *(float *)local_338.sz = (float)local_308;
          if ((Mat *)local_338._0_8_ == (Mat *)0x0) goto LAB_0011abc3;
        }
        pMVar13 = (Mat *)local_338._0_8_;
        SVar10 = (Size)((long)local_338.obj + (long)local_338.sz);
        if ((ulong)local_318 <= (ulong)((long)local_338.obj + (long)local_338.sz)) {
          cv::MatConstIterator::seek((long)&local_338,true);
          pMVar13 = (Mat *)local_338._0_8_;
          SVar10 = local_338.sz;
        }
      }
      local_338.sz = SVar10;
      cv::Mat::Mat((Mat *)local_268);
      local_268._0_8_ = local_268._0_8_ & 0xfffffffffffff000 | 5;
      cv::Mat_<float>::operator=((Mat_<float> *)local_268,pMVar13);
      local_308 = uVar12;
      cv::Mat::Mat((Mat *)local_118,(Mat *)local_268);
      cv::Mat::~Mat((Mat *)local_268);
      cv::Mat::~Mat((Mat *)local_1f8);
      (**(code **)(**(long **)((long)&(((local_310->localizations).
                                        super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_shared_ptr<ary::Localization>).
                                      super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + local_2d8) + 0x10))(&local_2a0);
      pSVar5 = local_2e0;
      local_338.sz.width = 0;
      local_338.sz.height = 0;
      local_338.flags = 0x1010000;
      local_338.obj = local_118;
      local_130.flags = -0x3efdfffb;
      local_130.sz.width = 1;
      local_130.sz.height = 3;
      local_148.flags = -0x3efdfffb;
      local_148.obj = (void *)((long)&local_2a0.elemSize + 4);
      local_148.sz.width = 1;
      local_148.sz.height = 3;
      local_130.obj = &local_2a0;
      CameraModel::getIntrinsics
                ((local_2e0->super_shared_ptr<ary::CameraModel>).
                 super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_160.flags = -0x3efdfffb;
      local_160.sz.width = 3;
      local_160.sz.height = 3;
      local_160.obj = (Mat *)local_1f8;
      CameraModel::getDistortion
                ((Mat *)local_268,
                 (pSVar5->super_shared_ptr<ary::CameraModel>).
                 super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_178.sz.width = 0;
      local_178.sz.height = 0;
      local_178.flags = 0x1010000;
      local_190.super__InputArray.sz.width = 0;
      local_190.super__InputArray.sz.height = 0;
      local_190.super__InputArray.flags = -0x7dfcfff3;
      local_190.super__InputArray.obj = &local_2b8;
      local_178.obj = (Mat *)local_268;
      p_Var9 = (_OutputArray *)cv::noArray();
      cv::projectPoints(&local_338,&local_130,&local_148,&local_160,&local_178,&local_190,p_Var9,0.0
                       );
      cv::Mat::~Mat((Mat *)local_268);
      local_1e8 = (uchar *)0x0;
      local_1f8._0_4_ = 3.7909693e-37;
      local_2c0 = (int)ROUND(local_2b8[2]);
      local_2bc = (int)ROUND(local_2b8[3]);
      local_2c8 = (int)ROUND(local_2b8[4]);
      local_2c4 = (int)ROUND(local_2b8[5]);
      local_268._0_4_ = 0;
      local_268._4_4_ = 0x406fe000;
      local_268._8_4_ = 0;
      local_268._12_4_ = 0x406fe000;
      local_258 = (uchar *)0x0;
      puStack_250 = (uchar *)0x0;
      uStack_1f0 = image;
      cv::line(local_1f8,&local_2c0,&local_2c8,(Mat *)local_268,2,8,
               (ulong)p_Var9 & 0xffffffff00000000);
      local_1e8 = (uchar *)0x0;
      local_1f8._0_4_ = 0x3010000;
      lVar7 = *(long *)((long)&(((local_310->anchors).
                                 super__Vector_base<cv::Ptr<ary::SceneAnchor>,_std::allocator<cv::Ptr<ary::SceneAnchor>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_shared_ptr<ary::SceneAnchor>).
                               super___shared_ptr<ary::SceneAnchor,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + local_2d8);
      lVar11 = *(long *)(lVar7 + 8);
      local_268._0_8_ = local_268 + 0x10;
      uStack_1f0 = image;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_268,lVar11,*(long *)(lVar7 + 0x10) + lVar11);
      uVar12 = local_308;
      local_2d0 = (int)ROUND(*local_2b8);
      local_2cc = (int)ROUND(local_2b8[1]);
      local_98 = 0x406fe00000000000;
      uStack_90 = 0x4059000000000000;
      local_88 = 0x406fe00000000000;
      uStack_80 = 0;
      cv::putText(0,local_1f8,(Mat *)local_268,&local_2d0,0,&local_98,2,8,0);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_);
      }
      cv::Mat::~Mat((Mat *)local_118);
      if (local_2b8 != (float *)0x0) {
        operator_delete(local_2b8);
      }
      uVar12 = uVar12 + 1;
      pPVar6 = (local_310->localizations).
               super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      model = local_2e0;
      this = local_310;
    } while (uVar12 < (ulong)((long)(local_310->localizations).
                                    super__Vector_base<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6 >> 4))
    ;
  }
  (*(this->super_Localization)._vptr_Localization[2])((CameraPosition *)local_1f8);
  CameraModel::getIntrinsics
            ((model->super_shared_ptr<ary::CameraModel>).
             super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CameraModel::getDistortion
            ((Mat *)local_118,
             (model->super_shared_ptr<ary::CameraModel>).
             super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  drawSystem(image,(CameraPosition *)local_1f8,(Matx33f *)local_268,(Mat *)local_118,0.1,3);
  cv::Mat::~Mat((Mat *)local_118);
  return;
}

Assistant:

void AnchoredLocalization::draw(Mat& image, SharedCameraModel& model) const {

    for (size_t i = 0; i < localizations.size(); i++) {
        localizations[i]->draw(image, model);

        std::vector<cv::Point2f> model2ImagePts;
        
        Matx44f offset = anchors[i]->getTransform();

        Point3f origin = extract_homogeneous(offset * Scalar(0, 0, 0, 1));

        Mat modelPts = (Mat_<float>(3, 3) <<
                        0.01, 0.01, 0.01,
                        0, 0, 0,
                        origin.x, origin.y, origin.z);

        CameraPosition camera = localizations[i]->getCameraPosition();

        projectPoints(modelPts, camera.rotation, camera.translation, model->getIntrinsics(), model->getDistortion(), model2ImagePts);

        line(image, model2ImagePts[1], model2ImagePts[2], Scalar(255, 255, 0), 2);

        putText(image, anchors[i]->getName(), model2ImagePts[0], FONT_HERSHEY_SIMPLEX, 0.5f, Scalar(255, 100, 255), 2);

    }

    drawSystem(image, getCameraPosition(), model->getIntrinsics(), model->getDistortion());

}